

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

string * __thiscall
absl::lts_20240722::flags_internal::FlagImpl::CurrentValue_abi_cxx11_
          (string *__return_storage_ptr__,FlagImpl *this)

{
  flags_internal *this_00;
  atomic<long> *paVar1;
  FlagOpFn op;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar2;
  uint uVar3;
  array<char,_8UL> one_word_val;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> local_30;
  void *pvVar4;
  
  local_30._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  _M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Tuple_impl<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>._M_head_impl.op
       = (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)
         DataGuard(this);
  uVar3 = *(uint *)&this->field_0x28 >> 1 & 3;
  pvVar4 = (void *)(ulong)uVar3;
  if (uVar3 < 2) {
    paVar1 = OneWordValue(this);
    local_30._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    _M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    super__Tuple_impl<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    super__Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>._M_head_impl.
    op = (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)
         (paVar1->super___atomic_base<long>)._M_i;
    Unparse_abi_cxx11_(__return_storage_ptr__,(flags_internal *)this->op_,(FlagOpFn)&local_30,pvVar4
                      );
  }
  else if (uVar3 == 2) {
    pvVar4 = (void *)0x0;
    op = (FlagOpFn)(*this->op_)(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
    DynValueDeleter::DynValueDeleter((DynValueDeleter *)&local_30,this->op_);
    local_30._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    _M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = op;
    ReadSequenceLockedData(this,op);
    Unparse_abi_cxx11_(__return_storage_ptr__,(flags_internal *)this->op_,op,pvVar4);
    std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
              (&local_30);
  }
  else {
    absl::lts_20240722::Mutex::Lock();
    this_00 = (flags_internal *)this->op_;
    paVar2 = PtrStorage(this);
    Unparse_abi_cxx11_(__return_storage_ptr__,this_00,
                       (FlagOpFn)((ulong)(paVar2->_M_i).ptr_ & 0xfffffffffffffffc),pvVar4);
    MutexLock::~MutexLock((MutexLock *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FlagImpl::CurrentValue() const {
  auto* guard = DataGuard();  // Make sure flag initialized
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      const auto one_word_val =
          absl::bit_cast<std::array<char, sizeof(int64_t)>>(
              OneWordValue().load(std::memory_order_acquire));
      return flags_internal::Unparse(op_, one_word_val.data());
    }
    case FlagValueStorageKind::kSequenceLocked: {
      std::unique_ptr<void, DynValueDeleter> cloned(flags_internal::Alloc(op_),
                                                    DynValueDeleter{op_});
      ReadSequenceLockedData(cloned.get());
      return flags_internal::Unparse(op_, cloned.get());
    }
    case FlagValueStorageKind::kHeapAllocated: {
      absl::MutexLock l(guard);
      return flags_internal::Unparse(
          op_, PtrStorage().load(std::memory_order_acquire).Ptr());
    }
  }

  return "";
}